

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::verify
          (ShaderAtomicAddCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  int iVar2;
  iterator iVar3;
  MessageBuilder *this_01;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  deUint32 dVar10;
  bool bVar11;
  int in_stack_00000008;
  long in_stack_00000010;
  set<int,_std::less<int>,_std::allocator<int>_> outValues;
  int local_240;
  int local_23c;
  ulong local_238;
  deUint32 local_22c;
  ShaderAtomicAddCase *local_228;
  deUint32 *local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  size_t local_208;
  ulong local_200;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1f8;
  ulong local_1c8;
  ulong local_1c0;
  size_t local_1b8;
  undefined1 local_1b0 [384];
  
  local_20c = (int)tbs;
  uVar5 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar4 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar5;
  local_220 = &(this->super_ShaderAtomicOpCase).m_initialValue;
  uVar7 = 0;
  local_200 = 0;
  if (0 < (int)uVar5) {
    local_200 = (ulong)uVar5;
  }
  local_210 = (int)uVar4;
  uVar8 = 0;
  if (0 < local_210) {
    uVar8 = uVar4 & 0xffffffff;
  }
  iVar9 = (int)sig;
  local_218 = uVar5 * iVar9;
  local_214 = uVar5 * local_20c;
  local_23c = 0;
  local_238 = 0;
  local_228 = this;
  local_208 = siglen;
  local_1c8 = uVar8;
  local_1b8 = tbslen;
  do {
    if (local_238 == uVar8) {
LAB_01246fef:
      return (int)CONCAT71((int7)(int3)((uint)local_210 >> 8),(long)local_210 <= (long)local_238);
    }
    local_22c = *(deUint32 *)(in_stack_00000010 + (int)local_238 * in_stack_00000008);
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1f8._M_impl.super__Rb_tree_header._M_header;
    local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    dVar10 = *local_220;
    uVar4 = local_200;
    iVar2 = local_23c;
    while (bVar11 = uVar4 != 0, uVar4 = uVar4 - 1, bVar11) {
      dVar10 = dVar10 + *(int *)(siglen + (long)iVar2);
      iVar2 = iVar2 + iVar9;
    }
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_22c != dVar10) {
      local_1b0._0_8_ =
           ((local_228->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,(int)local_238);
      std::operator<<((ostream *)poVar1,": expected sum ");
      std::ostream::operator<<(poVar1,dVar10);
      std::operator<<((ostream *)poVar1,", got ");
      std::ostream::operator<<(poVar1,local_22c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01246fdb:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1f8);
      goto LAB_01246fef;
    }
    bVar11 = false;
    iVar2 = local_23c;
    local_1c0 = uVar7;
    for (uVar4 = 0; local_200 != uVar4; uVar4 = uVar4 + 1) {
      iVar6 = local_22c - *(int *)(local_208 + (long)iVar2);
      local_240 = *(int *)(local_1b8 + (long)(int)uVar7);
      if ((iVar6 < local_240) || (local_240 < (int)*local_220)) {
        local_1b0._0_8_ =
             ((local_228->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,(int)local_238);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,(int)uVar4);
        std::operator<<((ostream *)poVar1,": expected value in range [");
        this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_220);
        this_00 = &this_01->m_str;
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
        std::ostream::operator<<(this_00,iVar6);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"], got ");
        std::ostream::operator<<(this_00,local_240);
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01246fdb;
      }
      iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&local_1f8,&local_240);
      if ((_Rb_tree_header *)iVar3._M_node != &local_1f8._M_impl.super__Rb_tree_header) {
        local_1b0._0_8_ =
             ((local_228->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,(int)local_238);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,(int)uVar4);
        std::operator<<((ostream *)poVar1,": found duplicate value ");
        std::ostream::operator<<(poVar1,local_240);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01246fdb;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_1f8,&local_240);
      bVar11 = (bool)(bVar11 | local_240 == iVar6);
      uVar7 = (ulong)(uint)((int)uVar7 + local_20c);
      iVar2 = iVar2 + iVar9;
    }
    if (!bVar11) {
      local_1b0._0_8_ =
           ((local_228->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: could not find maximum expected value from group ");
      std::ostream::operator<<(poVar1,(int)local_238);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01246fdb;
    }
    local_1b0._0_4_ = *local_220;
    iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_1f8,(key_type_conflict *)local_1b0);
    uVar4 = local_1c0;
    uVar8 = local_1c8;
    siglen = local_208;
    if ((_Rb_tree_header *)iVar3._M_node == &local_1f8._M_impl.super__Rb_tree_header) {
      local_1b0._0_8_ =
           ((local_228->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: could not find initial value from group ");
      std::ostream::operator<<(poVar1,(int)local_238);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_01246fdb;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1f8);
    local_238 = local_238 + 1;
    local_23c = local_23c + local_218;
    uVar7 = (ulong)(uint)((int)uVar4 + local_214);
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	outValues;
			bool		maxFound		= false;
			int			valueSum		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				valueSum += inputValue;
			}

			if (groupOutput != valueSum)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected sum " << valueSum << ", got " << groupOutput << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	inputValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				const int	outputValue		= *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, (int)m_initialValue, valueSum-inputValue))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected value in range [" << m_initialValue << ", " << (valueSum-inputValue)
														   << "], got " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				if (outValues.find(outputValue) != outValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found duplicate value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				outValues.insert(outputValue);
				if (outputValue == valueSum-inputValue)
					maxFound = true;
			}

			if (!maxFound)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find maximum expected value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}

			if (outValues.find((int)m_initialValue) == outValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}